

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cc
# Opt level: O3

void __thiscall tt::net::EventLoop::~EventLoop(EventLoop *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long in_FS_OFFSET;
  
  close(this->m_wakeupFd);
  *(undefined8 *)(in_FS_OFFSET + -0x40) = 0;
  p_Var1 = (this->m_wakeupChannel).super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
            (&this->m_pendingFunctors);
  pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  p_Var1 = (this->m_epoll).super___shared_ptr<tt::net::Epoll,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

EventLoop::~EventLoop(){
	
	close(m_wakeupFd);
	t_loopInTishThread = NULL;
}